

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall bssl::anon_unknown_0::SSLTest_SigAlgs_Test::TestBody(SSLTest_SigAlgs_Test *this)

{
  int *values;
  pointer puVar1;
  int iVar2;
  SSL_METHOD *meth;
  char *message;
  char *in_R9;
  int iVar3;
  long lVar4;
  bool *rhs;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<unsigned_short> __l_04;
  initializer_list<int> __l_05;
  initializer_list<unsigned_short> __l_06;
  initializer_list<int> __l_07;
  initializer_list<unsigned_short> __l_08;
  initializer_list<int> __l_09;
  initializer_list<unsigned_short> __l_10;
  initializer_list<int> __l_11;
  initializer_list<unsigned_short> __l_12;
  Span<const_unsigned_short> expected;
  allocator_type local_b6;
  allocator_type local_b5;
  allocator_type local_b4;
  allocator_type local_b3;
  allocator_type local_b2;
  allocator_type local_b1;
  allocator_type local_b0;
  allocator_type local_af;
  allocator_type local_ae;
  allocator_type local_ad;
  allocator_type local_ac;
  allocator_type local_ab;
  allocator_type local_aa;
  allocator_type local_a9;
  ScopedTrace gtest_trace_6324;
  AssertHelper local_a0;
  UniquePtr<SSL_CTX> ctx;
  bool ok;
  undefined7 uStack_87;
  unsigned_short local_80 [4];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int local_48;
  unsigned_short local_44 [2];
  int local_40 [4];
  
  if ((anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests);
    if (iVar3 != 0) {
      TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kTests[0].ok = true;
      TestBody::kTests[0].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kTests[0].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[0].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48 = 1;
      __l._M_len = 1;
      __l._M_array = &local_48;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[1].input,__l,&local_a9);
      TestBody::kTests[1].ok = false;
      TestBody::kTests[1].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[1].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      TestBody::kTests[1].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x200000001;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&ctx;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[2].input,__l_00,&local_aa);
      TestBody::kTests[2].ok = false;
      TestBody::kTests[2].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kTests[2].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[2].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.data_ = (AssertHelperData *)0x3b5000002a0;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_a0;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[3].input,__l_01,&local_ab);
      TestBody::kTests[3].ok = false;
      TestBody::kTests[3].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kTests[3].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[3].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x6000002;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x6000002a0;
      __l_02._M_len = 4;
      __l_02._M_array = (iterator)&gtest_ar;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[4].input,__l_02,&local_ac);
      TestBody::kTests[4].ok = false;
      TestBody::kTests[4].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kTests[4].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kTests[4].expected.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _gtest_trace_6324 = 0x6000002a0;
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)&gtest_trace_6324;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[5].input,__l_03,&local_ad);
      TestBody::kTests[5].ok = true;
      local_80[3] = 0x401;
      __l_04._M_len = 1;
      __l_04._M_array = local_80 + 3;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&TestBody::kTests[5].expected,__l_04,&local_ae);
      _ok = 0x6000002a2;
      __l_05._M_len = 2;
      __l_05._M_array = (iterator)&ok;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[6].input,__l_05,&local_af);
      TestBody::kTests[6].ok = true;
      local_80[2] = 0x601;
      __l_06._M_len = 1;
      __l_06._M_array = local_80 + 2;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&TestBody::kTests[6].expected,__l_06,&local_b0);
      local_40[2] = 0x2a0;
      local_40[3] = 0x390;
      __l_07._M_len = 2;
      __l_07._M_array = local_40 + 2;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[7].input,__l_07,&local_b1);
      TestBody::kTests[7].ok = true;
      local_80[1] = 0x804;
      __l_08._M_len = 1;
      __l_08._M_array = local_80 + 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&TestBody::kTests[7].expected,__l_08,&local_b2);
      local_40[0] = 0;
      local_40[1] = 0x3b5;
      __l_09._M_len = 2;
      __l_09._M_array = local_40;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[8].input,__l_09,&local_b3);
      TestBody::kTests[8].ok = true;
      local_80[0] = 0x807;
      __l_10._M_len = 1;
      __l_10._M_array = local_80;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&TestBody::kTests[8].expected,__l_10,&local_b4);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0x3b5000000;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x198000002a1;
      __l_11._M_len = 4;
      __l_11._M_array = (iterator)&gtest_ar_;
      std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[9].input,__l_11,&local_b5);
      TestBody::kTests[9].ok = true;
      local_44[0] = 0x807;
      local_44[1] = 0x503;
      __l_12._M_len = 2;
      __l_12._M_array = local_44;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&TestBody::kTests[9].expected,__l_12,&local_b6);
      __cxa_atexit(__cxx_global_array_dtor_1242,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests);
    }
  }
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_trace_6324,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x18b0,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_trace_6324,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_6324);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar3 = 1;
    rhs = &TestBody::kTests[0].ok;
    for (lVar4 = 0x230; lVar4 != 0; lVar4 = lVar4 + -0x38) {
      gtest_ar._0_4_ = iVar3;
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                (&gtest_trace_6324,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x18b4,(uint *)&gtest_ar);
      values = (((anon_struct_56_3_5277038f *)(rhs + -0x18))->input).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar2 = SSL_CTX_set1_sigalgs
                        ((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,values,
                         (long)*(pointer *)(rhs + -0x10) - (long)values >> 2);
      _ok = CONCAT71(uStack_87,iVar2 != 0);
      testing::internal::CmpHelperEQ<bool,bool>((internal *)&gtest_ar,"ok","test.ok",&ok,rhs);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        message = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x18b8,message);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      if (ok == false) {
        ERR_clear_error();
      }
      if (*rhs == true) {
        puVar1 = (((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(rhs + 8))->
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        expected.size_ = (long)*(pointer *)(rhs + 0x10) - (long)puVar1 >> 1;
        expected.data_ = puVar1;
        ExpectSigAlgsEqual(expected,*(Span<const_unsigned_short> *)
                                     (*(long *)(*(long *)((long)ctx._M_t.
                                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                                  _M_head_impl + 0x138) + 0x18) + 0x20));
      }
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_6324);
      rhs = rhs + 0x38;
      iVar3 = iVar3 + 1;
    }
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, SigAlgs) {
  static const struct {
    std::vector<int> input;
    bool ok;
    std::vector<uint16_t> expected;
  } kTests[] = {
      {{}, true, {}},
      {{1}, false, {}},
      {{1, 2, 3}, false, {}},
      {{NID_sha256, EVP_PKEY_ED25519}, false, {}},
      {{NID_sha256, EVP_PKEY_RSA, NID_sha256, EVP_PKEY_RSA}, false, {}},

      {{NID_sha256, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA256}},
      {{NID_sha512, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA512}},
      {{NID_sha256, EVP_PKEY_RSA_PSS}, true, {SSL_SIGN_RSA_PSS_RSAE_SHA256}},
      {{NID_undef, EVP_PKEY_ED25519}, true, {SSL_SIGN_ED25519}},
      {{NID_undef, EVP_PKEY_ED25519, NID_sha384, EVP_PKEY_EC},
       true,
       {SSL_SIGN_ED25519, SSL_SIGN_ECDSA_SECP384R1_SHA384}},
  };

  UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  unsigned n = 1;
  for (const auto &test : kTests) {
    SCOPED_TRACE(n++);

    const bool ok =
        SSL_CTX_set1_sigalgs(ctx.get(), test.input.data(), test.input.size());
    EXPECT_EQ(ok, test.ok);

    if (!ok) {
      ERR_clear_error();
    }

    if (!test.ok) {
      continue;
    }

    ExpectSigAlgsEqual(test.expected, ctx->cert->legacy_credential->sigalgs);
  }
}